

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RepeatedEventControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RepeatedEventControl,slang::ast::Expression_const&,slang::ast::TimingControl&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,TimingControl *args_1,SourceRange *args_2)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  RepeatedEventControl *pRVar3;
  
  pRVar3 = (RepeatedEventControl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RepeatedEventControl *)this->endPtr < pRVar3 + 1) {
    pRVar3 = (RepeatedEventControl *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pRVar3 + 1);
  }
  SVar1 = args_2->startLoc;
  SVar2 = args_2->endLoc;
  (pRVar3->super_TimingControl).kind = RepeatedEvent;
  (pRVar3->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pRVar3->super_TimingControl).sourceRange.startLoc = SVar1;
  (pRVar3->super_TimingControl).sourceRange.endLoc = SVar2;
  pRVar3->expr = args;
  pRVar3->event = args_1;
  return pRVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }